

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::checkRemoveKernelInfo(CLIntercept *this,cl_kernel kernel)

{
  cl_uint cVar1;
  cl_kernel in_RDI;
  cl_uint refCount;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
             ,(mutex_type *)in_RDI);
  cVar1 = getRefCount((CLIntercept *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                      in_RDI);
  if (cVar1 == 1) {
    std::
    map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
    ::erase((map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             *)CONCAT44(in_stack_ffffffffffffffd4,1),(key_type *)in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x209b45);
  return;
}

Assistant:

void CLIntercept::checkRemoveKernelInfo( cl_kernel kernel )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    cl_uint refCount = getRefCount( kernel );
    if( refCount == 1 )
    {
#if 0
        // We shouldn't remove the kernel name from the local kernel name map
        // here since the mapping may be included in the device performance
        // time report.
        m_LongKernelNameMap.erase( m_KernelInfoMap[ kernel ].KernelName );
#endif

        m_KernelInfoMap.erase( kernel );
    }
}